

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

void __thiscall gnuplotio::GnuplotTmpfile::~GnuplotTmpfile(GnuplotTmpfile *this)

{
  ostream *os;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  
  if (this->debug_messages == true) {
    os = std::operator<<((ostream *)&std::cerr,"delete tmpfile ");
    pbVar1 = boost::filesystem::operator<<(os,&this->file);
    std::endl<char,std::char_traits<char>>(pbVar1);
  }
  boost::filesystem::remove((char *)this);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~GnuplotTmpfile() {
        if(debug_messages) {
            std::cerr << "delete tmpfile " << file << std::endl;
        }
        // it is never good to throw exceptions from a destructor
        try {
            remove(file);
        } catch(const std::exception &) {
            std::cerr << "Failed to remove temporary file " << file << std::endl;
        }
    }